

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtAudio::RtAudio(RtAudio *this,Api api,RtAudioErrorCallback *errorCallback)

{
  RtApi *pRVar1;
  pointer pbVar2;
  pointer pbVar3;
  ostream *poVar4;
  uint uVar5;
  string errorMessage;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> apis;
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  this->rtapi_ = (RtApi *)0x0;
  errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
  errorMessage._M_string_length = 0;
  errorMessage.field_2._M_local_buf[0] = '\0';
  if (api != UNSPECIFIED) {
    openRtApi(this,api);
    pRVar1 = this->rtapi_;
    if (pRVar1 != (RtApi *)0x0) {
      if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_50,errorCallback);
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator=(&pRVar1->errorCallback_,&local_50);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
      }
      goto LAB_0010b7da;
    }
    std::__cxx11::string::assign((char *)&errorMessage);
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar4 = std::operator<<(poVar4,(string *)&errorMessage);
      poVar4 = std::operator<<(poVar4,'\n');
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(errorCallback,RTAUDIO_INVALID_USE,&errorMessage);
    }
  }
  apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getCompiledApi(&apis);
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar5) break;
    openRtApi(this,apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5]);
    if (this->rtapi_ != (RtApi *)0x0) {
      RtApi::getDeviceNames_abi_cxx11_(&local_68,this->rtapi_);
      pbVar3 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (pbVar3 != pbVar2) break;
    }
    uVar5 = uVar5 + 1;
  }
  pRVar1 = this->rtapi_;
  if (pRVar1 == (RtApi *)0x0) {
    std::__cxx11::string::assign((char *)&errorMessage);
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar4 = std::operator<<(poVar4,(string *)&errorMessage);
      poVar4 = std::operator<<(poVar4,'\n');
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(errorCallback,RTAUDIO_INVALID_USE,&errorMessage);
    }
    abort();
  }
  if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_88,errorCallback);
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&pRVar1->errorCallback_,&local_88);
    std::_Function_base::~_Function_base(&local_88.super__Function_base);
  }
  std::_Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>::~_Vector_base
            (&apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>);
LAB_0010b7da:
  std::__cxx11::string::~string((string *)&errorMessage);
  return;
}

Assistant:

RtAudio :: RtAudio( RtAudio::Api api, RtAudioErrorCallback&& errorCallback )
{
  rtapi_ = 0;

  std::string errorMessage;
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openRtApi( api );

    if ( rtapi_ ) {
      if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
      return;
    }

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    errorMessage = "RtAudio: no compiled support for specified API argument!";
    if ( errorCallback )
      errorCallback( RTAUDIO_INVALID_USE, errorMessage );
    else
      std::cerr << '\n' << errorMessage << '\n' << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one device or we reach the end of the list.
  std::vector< RtAudio::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openRtApi( apis[i] );
    if ( rtapi_ && (rtapi_->getDeviceNames()).size() > 0 )
      break;
  }

  if ( rtapi_ ) {
    if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
    return;
  }

  // It should not be possible to get here because the preprocessor
  // definition __RTAUDIO_DUMMY__ is automatically defined in RtAudio.h
  // if no API-specific definitions are passed to the compiler. But just
  // in case something weird happens, issue an error message and abort.
  errorMessage = "RtAudio: no compiled API support found ... critical error!";
  if ( errorCallback )
    errorCallback( RTAUDIO_INVALID_USE, errorMessage );
  else
    std::cerr << '\n' << errorMessage << '\n' << std::endl;
  abort();
}